

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

int __thiscall KDIS::NETWORK::Connection::shutdown(Connection *this,int __fd,int __how)

{
  KException *this_00;
  int *piVar1;
  KCHAR8 *__s;
  allocator<char> local_45 [13];
  KString local_38;
  int local_18;
  char local_11;
  KINT32 iError;
  KINT8 i;
  Connection *this_local;
  
  local_11 = '\0';
  _iError = this;
  do {
    if (1 < local_11) {
      return (int)local_11;
    }
    if (this->m_iSocket[local_11] != 0) {
      local_18 = close(this->m_iSocket[local_11]);
      if (local_18 == -1) {
        this_00 = (KException *)__cxa_allocate_exception(0x30);
        piVar1 = __errno_location();
        __s = getErrorText(this,*piVar1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,local_45);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      this->m_iSocket[local_11] = 0;
    }
    local_11 = local_11 + '\x01';
  } while( true );
}

Assistant:

void Connection::shutdown() noexcept(false)
{
    for( KINT8 i = 0; i < 2; ++i )
    {
        if( m_iSocket[i] )
        {
            #if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
                KINT32 iError = closesocket( m_iSocket[i] );
            #else
                KINT32 iError = close( m_iSocket[i] );
            #endif

            if( iError == SOCKET_ERROR )
            {
                THROW_ERROR;
            }

            m_iSocket[i] = 0;
        }
    }
}